

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

QStringView __thiscall
QXmlStreamAttributes::value
          (QXmlStreamAttributes *this,QAnyStringView namespaceUri,QAnyStringView name)

{
  QStringView QVar1;
  QStringView v;
  QStringView v_00;
  bool bVar2;
  const_iterator o;
  long in_FS_OFFSET;
  QStringView QVar3;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QAnyStringView *in_stack_fffffffffffffef8;
  QAnyStringView *in_stack_ffffffffffffff00;
  QAnyStringView *in_stack_ffffffffffffff08;
  qsizetype in_stack_ffffffffffffff10;
  storage_type_conflict *in_stack_ffffffffffffff18;
  bool local_c9;
  const_iterator local_40 [5];
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40[0].i = (QXmlStreamAttribute *)&DAT_aaaaaaaaaaaaaaaa;
  local_40[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_ffffffffffffff00);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_ffffffffffffff00);
  do {
    bVar2 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_40,o);
    if (!bVar2) {
      QStringView::QStringView(&local_18);
      QVar3.m_data = local_18.m_data;
      QVar3.m_size = (qsizetype)in_stack_ffffffffffffff18;
LAB_0064b750:
      local_18.m_data = QVar3.m_data;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      QVar1.m_data = local_18.m_data;
      QVar1.m_size = local_18.m_size;
      return QVar1;
    }
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_40);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x64b636);
    v.m_data = in_stack_ffffffffffffff18;
    v.m_size = in_stack_ffffffffffffff10;
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff08,v);
    bVar2 = ::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_c9 = false;
    if (bVar2) {
      QXmlStreamAttribute::namespaceUri((QXmlStreamAttribute *)0x64b69e);
      v_00.m_data = in_stack_ffffffffffffff18;
      v_00.m_size = in_stack_ffffffffffffff10;
      QAnyStringView::QAnyStringView(in_stack_ffffffffffffff08,v_00);
      local_c9 = ::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    if (local_c9 != false) {
      QVar3 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x64b705);
      local_18.m_size = QVar3.m_size;
      goto LAB_0064b750;
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_40);
  } while( true );
}

Assistant:

QStringView QXmlStreamAttributes::value(QAnyStringView namespaceUri, QAnyStringView name) const noexcept
{
    for (const QXmlStreamAttribute &attribute : *this) {
        if (attribute.name() == name && attribute.namespaceUri() == namespaceUri)
            return attribute.value();
    }
    return QStringView();
}